

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

void __thiscall
opts::
OptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
OptionContainer(OptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,char s_,string *l_,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_,string *help_
               ,string *type_)

{
  pointer pcVar1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (l_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + l_->_M_string_length);
  default_value(&local_50,var_);
  pcVar1 = (type_->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + type_->_M_string_length);
  pcVar1 = (help_->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + help_->_M_string_length);
  BasicOption::BasicOption(&this->super_BasicOption,s_,&local_b0,&local_50,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  (this->super_BasicOption)._vptr_BasicOption = (_func_int **)&PTR__BasicOption_00310a88;
  this->var = var_;
  return;
}

Assistant:

OptionContainer(char               s_,
                                    const std::string& l_,
                                    T&                 var_,
                                    const std::string& help_,
                                    const std::string& type_ = Traits<T>::type_string()):
                        BasicOption(s_, l_, default_value(var_), type_, help_),
                        var(&var_)                  {}